

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.h
# Opt level: O0

void __thiscall
wallet::CoinSelectionParams::CoinSelectionParams
          (CoinSelectionParams *this,FastRandomContext *rng_fast,int change_output_size,
          int change_spend_size,CAmount min_change_target,CFeeRate effective_feerate,
          CFeeRate long_term_feerate,CFeeRate discard_feerate,int tx_noinputs_size,
          bool avoid_partial,optional<int> max_tx_weight)

{
  long lVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined7 in_stack_00000008;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 1) = in_EDX;
  *(undefined4 *)((long)in_RDI + 0xc) = in_ECX;
  in_RDI[2] = in_R8;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = in_R9;
  in_RDI[7] = CONCAT17(avoid_partial,in_stack_00000008);
  in_RDI[8] = min_change_target;
  *(int *)(in_RDI + 9) = change_spend_size;
  *(undefined1 *)((long)in_RDI + 0x4c) = 0;
  *(byte *)((long)in_RDI + 0x4d) = (byte)rng_fast & 1;
  *(undefined1 *)((long)in_RDI + 0x4e) = 0;
  in_RDI[10] = this;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CoinSelectionParams(FastRandomContext& rng_fast, int change_output_size, int change_spend_size,
                        CAmount min_change_target, CFeeRate effective_feerate,
                        CFeeRate long_term_feerate, CFeeRate discard_feerate, int tx_noinputs_size, bool avoid_partial,
                        std::optional<int> max_tx_weight = std::nullopt)
        : rng_fast{rng_fast},
          change_output_size(change_output_size),
          change_spend_size(change_spend_size),
          m_min_change_target(min_change_target),
          m_effective_feerate(effective_feerate),
          m_long_term_feerate(long_term_feerate),
          m_discard_feerate(discard_feerate),
          tx_noinputs_size(tx_noinputs_size),
          m_avoid_partial_spends(avoid_partial),
          m_max_tx_weight(max_tx_weight)
    {
    }